

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

int soplex::LPFreadColName<double>
              (char **pos,NameSet *colnames,LPColSetBase<double> *colset,LPColBase<double> *emptycol
              ,SPxOut *spxout)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  SPxOut *pSVar7;
  long lVar8;
  Verbosity old_verbosity;
  char name [8192];
  
  pcVar3 = *pos;
  lVar8 = -1;
  do {
    cVar2 = pcVar3[lVar8 + 1];
    pvVar5 = memchr("+-.<>= ",(int)cVar2,8);
    lVar8 = lVar8 + 1;
    if (pvVar5 != (void *)0x0) break;
  } while (cVar2 != '\0');
  uVar6 = 0;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    pcVar1 = pcVar3 + uVar6;
    name[uVar6] = *pcVar1;
    uVar6 = uVar6 + 1;
    *pos = pcVar1 + 1;
  }
  name[uVar6 & 0xffffffff] = '\0';
  iVar4 = NameSet::number(colnames,name);
  if (iVar4 < 0) {
    if (emptycol == (LPColBase<double> *)0x0) {
      if ((spxout != (SPxOut *)0x0) && (old_verbosity = spxout->m_verbosity, 0 < (int)old_verbosity)
         ) {
        (*spxout->_vptr_SPxOut[2])(spxout);
        pSVar7 = operator<<(spxout,"WLPFRD02 Unknown variable \"");
        pSVar7 = operator<<(pSVar7,name);
        operator<<(pSVar7,"\" ");
        (*spxout->_vptr_SPxOut[2])(spxout,&old_verbosity);
      }
    }
    else {
      iVar4 = (colnames->set).thenum;
      NameSet::add(colnames,name);
      LPColSetBase<double>::add(colset,emptycol);
    }
  }
  uVar6 = (ulong)(byte)**pos;
  if ((uVar6 < 0x21) && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
    *pos = *pos + 1;
  }
  return iVar4;
}

Assistant:

static int LPFreadColName(char*& pos, NameSet* colnames, LPColSetBase<R>& colset,
                          const LPColBase<R>* emptycol, SPxOut* spxout)
{
   assert(LPFisColName(pos));
   assert(colnames != nullptr);

   char        name[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   int         i;
   int         colidx;

   // These are the characters that are not allowed in a column name.
   while((strchr("+-.<>= ", *s) == nullptr) && (*s != '\0'))
      s++;

   for(i = 0; pos != s; i++, pos++)
      name[i] = *pos;

   name[i] = '\0';

   if((colidx = colnames->number(name)) < 0)
   {
      // We only add the name if we got an empty column.
      if(emptycol == nullptr)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD02 Unknown variable \"" << name << "\" ";)
      }
      else
      {
         colidx = colnames->num();
         colnames->add(name);
         colset.add(*emptycol);
      }
   }

   SPxOut::debug(spxout, "DLPFRD03 LPFreadColName [{}] = {}\n", name, colidx);

   if(LPFisSpace(*pos))
      pos++;

   return colidx;
}